

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string_view __thiscall
google::protobuf::Reflection::GetRepeatedStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,int index,ScratchSpace *scratch)

{
  CppStringType CVar1;
  uint32_t uVar2;
  Cord *cord;
  string *psVar3;
  string_view sVar4;
  LogMessageFatal LStack_38;
  
  if ((field->field_0x1 & 8) == 0) {
    CVar1 = FieldDescriptor::cpp_string_type(field);
    if ((CVar1 != kView) && (CVar1 != kString)) {
      if (CVar1 != kCord) {
        internal::Unreachable
                  ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x8a2);
      }
      cord = GetRepeatedField<absl::lts_20250127::Cord>(this,message,field,index);
      if (scratch != (ScratchSpace *)0x0) {
        sVar4 = ScratchSpace::CopyFromCord(scratch,cord);
        return sVar4;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x89b,"scratch");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
    }
    psVar3 = GetRepeatedPtrField<std::__cxx11::string>(this,message,field,index);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar3 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        field->number_,index);
  }
  sVar4._M_str = (psVar3->_M_dataplus)._M_p;
  sVar4._M_len = psVar3->_M_string_length;
  return sVar4;
}

Assistant:

absl::string_view Reflection::GetRepeatedStringViewImpl(
    const Message& message, const FieldDescriptor* field, int index,
    ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto& cord = GetRepeatedField<absl::Cord>(message, field, index);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString:
      return GetRepeatedPtrField<std::string>(message, field, index);
  }
  internal::Unreachable();
}